

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zopflipng_bin.cc
# Opt level: O3

void ShowHelp(void)

{
  puts("==================================================");
  printf("ZopfliPNG v%s (@chrissimpkins derivative)\n","2.3.0");
  puts(
      "A Portable Network Graphics (PNG) image optimizer\nApache License, Version 2.0\n==================================================\n\nUsage: zopflipng [options]... infile.png outfile.png\n       zopflipng [options]... --prefix=[fileprefix] [files.png]...\n\nIf the output file exists, it is considered a result from a previous run and not overwritten if its filesize is smaller.\n\nOptions:\n--prefix=[fileprefix]: Adds a prefix to output filenames. May also contain a directory path. When using a prefix, multiple input files can be given and the output filenames are generated with the prefix\n If --prefix is specified without value, \'zopfli_\' is used.\n If input file names contain the prefix, they are not processed but considered as output from previous runs. This is handy when using *.png wildcard expansion with multiple runs.\n-y: do not ask about overwriting files.\n--lossy_transparent: remove colors behind alpha channel 0. No visual difference, removes hidden information.\n--lossy_8bit: convert 16-bit per channel image to 8-bit per channel.\n-d: dry run: don\'t save any files, just see the console output (e.g. for benchmarking)\n--always_zopflify: always output the image encoded by Zopfli, even if it\'s bigger than the original, for benchmarking the algorithm. Not good for real optimization.\n-q: use quick, but not very good, compression (e.g. for only trying the PNG filter and color types)\n--iterations=[number]: number of iterations, more iterations makes it slower but provides slightly better compression. Default: 15 for small files, 5 for large files.\n--splitting=[0-3]: ignored, left for backwards compatibility\n--filters=[types]: filter strategies to try:\n 0-4: give all scanlines PNG filter type 0-4\n m: minimum sum\n e: entropy\n p: predefined (keep from input, this likely overlaps another strategy)\n b: brute force (experimental)\n By default, if this argument is not given, one that is most likely the best for this image is chosen by trying faster compression with each type.\n If this argument is used, all given filter types are trie..." /* TRUNCATED STRING LITERAL */
      );
  return;
}

Assistant:

void ShowHelp() {
  printf("==================================================\n");
  printf("ZopfliPNG v%s (@chrissimpkins derivative)\n", ZOPFLIPNG_VERSION);
  printf("A Portable Network Graphics (PNG) image optimizer\n"
         "Apache License, Version 2.0\n"
         "==================================================\n"
         "\n"
         "Usage: zopflipng [options]... infile.png outfile.png\n"
         "       zopflipng [options]... --prefix=[fileprefix] [files.png]...\n"
         "\n"
         "If the output file exists, it is considered a result from a"
         " previous run and not overwritten if its filesize is smaller.\n"
         "\n"
         "Options:\n"
         "--prefix=[fileprefix]: Adds a prefix to output filenames. May also"
         " contain a directory path. When using a prefix, multiple input files"
         " can be given and the output filenames are generated with the"
         " prefix\n"
         " If --prefix is specified without value, 'zopfli_' is used.\n"
         " If input file names contain the prefix, they are not processed but"
         " considered as output from previous runs. This is handy when using"
         " *.png wildcard expansion with multiple runs.\n"
         "-y: do not ask about overwriting files.\n"
         "--lossy_transparent: remove colors behind alpha channel 0. No visual"
         " difference, removes hidden information.\n"
         "--lossy_8bit: convert 16-bit per channel image to 8-bit per"
         " channel.\n"
         "-d: dry run: don't save any files, just see the console output"
         " (e.g. for benchmarking)\n"
         "--always_zopflify: always output the image encoded by Zopfli, even if"
         " it's bigger than the original, for benchmarking the algorithm. Not"
         " good for real optimization.\n"
         "-q: use quick, but not very good, compression"
         " (e.g. for only trying the PNG filter and color types)\n"
         "--iterations=[number]: number of iterations, more iterations makes it"
         " slower but provides slightly better compression. Default: 15 for"
         " small files, 5 for large files.\n"
         "--splitting=[0-3]: ignored, left for backwards compatibility\n"
         "--filters=[types]: filter strategies to try:\n"
         " 0-4: give all scanlines PNG filter type 0-4\n"
         " m: minimum sum\n"
         " e: entropy\n"
         " p: predefined (keep from input, this likely overlaps another"
         " strategy)\n"
         " b: brute force (experimental)\n"
         " By default, if this argument is not given, one that is most likely"
         " the best for this image is chosen by trying faster compression with"
         " each type.\n"
         " If this argument is used, all given filter types"
         " are tried with slow compression and the best result retained. A good"
         " set of filters to try is --filters=0me.\n"
         "--keepchunks=nAME,nAME,...: keep metadata chunks with these names"
         " that would normally be removed, e.g. tEXt,zTXt,iTXt,gAMA, ... \n"
         " Due to adding extra data, this increases the result size. Keeping"
         " bKGD or sBIT chunks may cause additional worse compression due to"
         " forcing a certain color type, it is advised to not keep these for"
         " web images because web browsers do not use these chunks. By default"
         " ZopfliPNG only keeps (and losslessly modifies) the following chunks"
         " because they are essential: IHDR, PLTE, tRNS, IDAT and IEND.\n"
         "--keepcolortype: Keep original color type (RGB, RGBA, gray,"
         " gray+alpha or palette) and bit depth of the PNG.\n"
         " This results in a loss of compression opportunities, e.g. it will no"
         " longer convert a 4-channel RGBA image to 2-channel gray+alpha if the"
         " image only had translucent gray pixels.\n"
         " May be useful if a device does not support decoding PNGs of a"
         " particular color type.\n"
         "\n"
         "Usage examples:\n"
         "Optimize a file and overwrite if smaller: zopflipng infile.png"
         " outfile.png\n"
         "Optimize multiple files: zopflipng --prefix a.png b.png c.png\n"
         "Compress really well and try all filter strategies: zopflipng"
         " --iterations=500 --filters=01234mepb --lossy_8bit"
         " --lossy_transparent infile.png outfile.png\n");
}